

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

unsigned_long
cppforth::Forth::parseUnsignedNumber
          (const_iterator beginIt,const_iterator endIt,const_iterator *it,int numericBase)

{
  byte c;
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  int local_3c;
  
  it->_M_current = (char *)beginIt;
  uVar3 = 0;
  local_3c = -0x30;
  do {
    if (endIt._M_current <= it->_M_current) {
      return uVar3;
    }
    c = *it->_M_current;
    bVar1 = isValidDigit(c,numericBase);
    if (bVar1) {
      iVar2 = local_3c;
      if (0x40 < c) {
        iVar2 = -0x37;
      }
      if (0x60 < c) {
        iVar2 = -0x57;
      }
      uVar3 = uVar3 * (long)numericBase + (ulong)((uint)c + iVar2);
      it->_M_current = it->_M_current + 1;
    }
  } while (bVar1);
  return uVar3;
}

Assistant:

static unsigned long parseUnsignedNumber(const std::string::const_iterator beginIt, const std::string::const_iterator endIt, 
				std::string::const_iterator &it, int numericBase) {
			it = beginIt;
			unsigned long value=0;
			while (it < endIt) {
				auto c = (*it);
				if (isValidDigit(c, numericBase)) {
					auto n = digitValue(c);
					value = value * numericBase + n;
					++it;
				}
				else {
					break;
				}
			}
			return value;
		}